

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_file_tests.cpp
# Opt level: O1

void __thiscall
iu_StdFileUnitTest_x_iutest_x_ReadWrite_Test::Body
          (iu_StdFileUnitTest_x_iutest_x_ReadWrite_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *in_R9;
  unsigned_long *actual;
  AssertionResult iutest_ar;
  StdioFile file;
  char wbuf [17];
  FilePath filename;
  char rbuf [32];
  type **in_stack_fffffffffffffd48;
  allocator<char> local_2a9;
  AssertionResult local_2a8;
  AssertionHelper local_280;
  string local_250;
  StdioFile local_230;
  char local_218 [32];
  iuFilePath local_1f8;
  char local_1d8 [40];
  undefined1 local_1b0 [392];
  
  builtin_strncpy(local_218,"test1234abcdWXYZ",0x11);
  local_1d8[0x10] = '\0';
  local_1d8[0x11] = '\0';
  local_1d8[0x12] = '\0';
  local_1d8[0x13] = '\0';
  local_1d8[0x14] = '\0';
  local_1d8[0x15] = '\0';
  local_1d8[0x16] = '\0';
  local_1d8[0x17] = '\0';
  local_1d8[0x18] = '\0';
  local_1d8[0x19] = '\0';
  local_1d8[0x1a] = '\0';
  local_1d8[0x1b] = '\0';
  local_1d8[0x1c] = '\0';
  local_1d8[0x1d] = '\0';
  local_1d8[0x1e] = '\0';
  local_1d8[0x1f] = '\0';
  local_1d8[0] = '\0';
  local_1d8[1] = '\0';
  local_1d8[2] = '\0';
  local_1d8[3] = '\0';
  local_1d8[4] = '\0';
  local_1d8[5] = '\0';
  local_1d8[6] = '\0';
  local_1d8[7] = '\0';
  local_1d8[8] = '\0';
  local_1d8[9] = '\0';
  local_1d8[10] = '\0';
  local_1d8[0xb] = '\0';
  local_1d8[0xc] = '\0';
  local_1d8[0xd] = '\0';
  local_1d8[0xe] = '\0';
  local_1d8[0xf] = '\0';
  local_230.super_IFile.super_IOutStream._vptr_IOutStream = (_func_int **)&PTR__StdioFile_00186c28;
  local_230.super_IFile.super_IInStream._vptr_IInStream = (_func_int **)&PTR__StdioFile_00186c78;
  local_230.m_fp = (FILE *)0x0;
  iutest::detail::iuFilePath::iuFilePath(&local_1f8,"./testdata/unit_file_tests.tmp");
  iVar3 = (*local_230.super_IFile.super_IOutStream._vptr_IOutStream[5])
                    (&local_230,local_1f8.m_path._M_dataplus._M_p,2);
  paVar1 = &local_2a8.m_message.field_2;
  local_2a8.m_message._M_string_length = 0;
  local_2a8.m_message.field_2._M_local_buf[0] = '\0';
  local_2a8.m_result = SUB41(iVar3,0);
  local_2a8.m_message._M_dataplus._M_p = (pointer)paVar1;
  if (local_2a8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_250,(internal *)&local_2a8,
               (AssertionResult *)"file.Open(filename.string().c_str(), iutest::IFile::OpenWrite)",
               "false","true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,local_250._M_dataplus._M_p,&local_2a9);
    local_280.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
    ;
    local_280.m_part_result.super_iuCodeMessage.m_line = 0x35;
    local_280.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_280,(Fixed *)local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (uint)local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_280.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (uint)local_280.m_part_result.super_iuCodeMessage.m_message.
                                     _M_dataplus._M_p),
                      local_280.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8.m_message._M_dataplus._M_p,
                      CONCAT71(local_2a8.m_message.field_2._M_allocated_capacity._1_7_,
                               local_2a8.m_message.field_2._M_local_buf[0]) + 1);
    }
    goto LAB_001489bc;
  }
  local_2a8.m_message.field_2._M_local_buf[0] = '\0';
  local_2a8.m_message._M_string_length = 0;
  bVar2 = iutest::StdioFile::Write(&local_230,local_218,4,4);
  local_2a8.m_message._M_string_length = 0;
  local_2a8.m_message.field_2._M_local_buf[0] = '\0';
  local_2a8.m_message._M_dataplus._M_p = (pointer)paVar1;
  local_2a8.m_result = bVar2;
  if (!bVar2) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_250,(internal *)&local_2a8,(AssertionResult *)"file.Write(wbuf, 4, 4)","false"
               ,"true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,local_250._M_dataplus._M_p,&local_2a9);
    local_280.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
    ;
    local_280.m_part_result.super_iuCodeMessage.m_line = 0x36;
    local_280.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_280,(Fixed *)local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (uint)local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_280.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (uint)local_280.m_part_result.super_iuCodeMessage.m_message.
                                     _M_dataplus._M_p),
                      local_280.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8.m_message._M_dataplus._M_p,
                      CONCAT71(local_2a8.m_message.field_2._M_allocated_capacity._1_7_,
                               local_2a8.m_message.field_2._M_local_buf[0]) + 1);
    }
    if (!bVar2) goto LAB_001489bc;
  }
  iVar3 = (*local_230.super_IFile.super_IOutStream._vptr_IOutStream[5])
                    (&local_230,local_1f8.m_path._M_dataplus._M_p,1);
  local_2a8.m_message._M_string_length = 0;
  local_2a8.m_message.field_2._M_local_buf[0] = '\0';
  local_2a8.m_result = SUB41(iVar3,0);
  if (local_2a8.m_result == false) {
    local_2a8.m_message._M_dataplus._M_p = (pointer)paVar1;
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_250,(internal *)&local_2a8,
               (AssertionResult *)"file.Open(filename.string().c_str(), iutest::IFile::OpenRead)",
               "false","true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,local_250._M_dataplus._M_p,&local_2a9);
    local_280.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
    ;
    local_280.m_part_result.super_iuCodeMessage.m_line = 0x37;
    local_280.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_280,(Fixed *)local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (uint)local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_280.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (uint)local_280.m_part_result.super_iuCodeMessage.m_message.
                                     _M_dataplus._M_p),
                      local_280.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8.m_message._M_dataplus._M_p,
                      CONCAT71(local_2a8.m_message.field_2._M_allocated_capacity._1_7_,
                               local_2a8.m_message.field_2._M_local_buf[0]) + 1);
    }
    goto LAB_001489bc;
  }
  local_2a8.m_message.field_2._M_local_buf[0] = '\0';
  local_2a8.m_message._M_string_length = 0;
  local_2a8.m_message._M_dataplus._M_p = (pointer)paVar1;
  sVar4 = fread(local_1d8,4,4,(FILE *)local_230.m_fp);
  local_2a8.m_result = sVar4 >= 4;
  local_2a8.m_message._M_string_length = 0;
  local_2a8.m_message.field_2._M_local_buf[0] = '\0';
  if (sVar4 < 4) {
    local_2a8.m_message._M_dataplus._M_p = (pointer)paVar1;
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_250,(internal *)&local_2a8,(AssertionResult *)"file.Read(rbuf, 4, 4)","false",
               "true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,local_250._M_dataplus._M_p,&local_2a9);
    local_280.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
    ;
    local_280.m_part_result.super_iuCodeMessage.m_line = 0x38;
    local_280.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_280,(Fixed *)local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (uint)local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_280.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (uint)local_280.m_part_result.super_iuCodeMessage.m_message.
                                     _M_dataplus._M_p),
                      local_280.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
LAB_0014897c:
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
LAB_00148984:
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
  }
  else {
    actual = &iutest_type_traits::enabler_t<void>::value;
    local_2a8.m_message._M_dataplus._M_p = (pointer)paVar1;
    iutest::internal::CmpHelperSTREQ<char*,char*>
              (&local_2a8,(internal *)"wbuf","rbuf",local_218,local_1d8,
               (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffd48);
    if (local_2a8.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,local_2a8.m_message._M_dataplus._M_p,
                 (allocator<char> *)&local_250);
      local_280.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
      ;
      local_280.m_part_result.super_iuCodeMessage.m_line = 0x39;
      local_280.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_280,(Fixed *)local_1b0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      (uint)local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p)
          != &local_280.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 (uint)local_280.m_part_result.super_iuCodeMessage.m_message.
                                       _M_dataplus._M_p),
                        local_280.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8.m_message._M_dataplus._M_p,
                      CONCAT71(local_2a8.m_message.field_2._M_allocated_capacity._1_7_,
                               local_2a8.m_message.field_2._M_local_buf[0]) + 1);
    }
    local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 0;
    local_1b0._0_8_ = iutest::StdioFile::GetSize(local_230.m_fp);
    if ((ulong)(uint)local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p <
        (ulong)local_1b0._0_8_) {
      local_2a8.m_message._M_string_length = 0;
      local_2a8.m_message.field_2._M_local_buf[0] = '\0';
      local_2a8.m_result = true;
      local_2a8.m_message._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      actual = (unsigned_long *)local_1b0;
      iutest::internal::CmpHelperOpFailure<unsigned_int,unsigned_long>
                (&local_2a8,(internal *)"0u","file.GetSize()","<",(char *)&local_280,(uint *)actual,
                 (unsigned_long *)in_stack_fffffffffffffd48);
    }
    if (local_2a8.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,local_2a8.m_message._M_dataplus._M_p,
                 (allocator<char> *)&local_250);
      local_280.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
      ;
      local_280.m_part_result.super_iuCodeMessage.m_line = 0x3a;
      local_280.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_280,(Fixed *)local_1b0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      (uint)local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p)
          != &local_280.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 (uint)local_280.m_part_result.super_iuCodeMessage.m_message.
                                       _M_dataplus._M_p),
                        local_280.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8.m_message._M_dataplus._M_p,
                      CONCAT71(local_2a8.m_message.field_2._M_allocated_capacity._1_7_,
                               local_2a8.m_message.field_2._M_local_buf[0]) + 1);
    }
    local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 0;
    local_1b0._0_8_ = 0;
    iutest::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              (&local_2a8,(internal *)"0u","::iutest::StdioFile::GetSize(__null)",(char *)&local_280
               ,(uint *)local_1b0,actual);
    if (local_2a8.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,local_2a8.m_message._M_dataplus._M_p,
                 (allocator<char> *)&local_250);
      local_280.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
      ;
      local_280.m_part_result.super_iuCodeMessage.m_line = 0x3b;
      local_280.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_280,(Fixed *)local_1b0,false);
      local_250._M_dataplus._M_p =
           (pointer)CONCAT44(local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p.
                             _4_4_,(uint)local_280.m_part_result.super_iuCodeMessage.m_message.
                                         _M_dataplus._M_p);
      local_250.field_2._M_allocated_capacity =
           local_280.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p !=
          &local_280.m_part_result.super_iuCodeMessage.m_message.field_2) goto LAB_0014897c;
      goto LAB_00148984;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.m_message._M_dataplus._M_p,
                    CONCAT71(local_2a8.m_message.field_2._M_allocated_capacity._1_7_,
                             local_2a8.m_message.field_2._M_local_buf[0]) + 1);
  }
LAB_001489bc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_path._M_dataplus._M_p != &local_1f8.m_path.field_2) {
    operator_delete(local_1f8.m_path._M_dataplus._M_p,
                    local_1f8.m_path.field_2._M_allocated_capacity + 1);
  }
  local_230.super_IFile.super_IOutStream._vptr_IOutStream = (_func_int **)&PTR__StdioFile_00186c28;
  local_230.super_IFile.super_IInStream._vptr_IInStream = (_func_int **)&PTR__StdioFile_00186c78;
  if ((FILE *)local_230.m_fp != (FILE *)0x0) {
    fclose((FILE *)local_230.m_fp);
  }
  return;
}

Assistant:

IUTEST(StdFileUnitTest, ReadWrite)
{
    char wbuf[] = "test1234abcdWXYZ";
    char rbuf[32] = { 0 };
    ::iutest::StdioFile file;
    ::iutest::internal::FilePath filename("./testdata/unit_file_tests.tmp");
    IUTEST_ASSERT_TRUE( file.Open(filename.string().c_str(), iutest::IFile::OpenWrite) );
    IUTEST_ASSERT_TRUE( file.Write(wbuf, 4, 4));
    IUTEST_ASSERT_TRUE( file.Open(filename.string().c_str(), iutest::IFile::OpenRead) );
    IUTEST_ASSERT_TRUE( file.Read(rbuf, 4, 4));
    IUTEST_EXPECT_STREQ(wbuf, rbuf);
    IUTEST_EXPECT_LT(0u, file.GetSize());
    IUTEST_EXPECT_EQ(0u, ::iutest::StdioFile::GetSize(NULL));
}